

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O2

leb_DiamondParent leb_DecodeDiamondParent(leb_Node node)

{
  uint uVar1;
  leb_SameDepthNeighborIDs lVar2;
  leb_DiamondParent lVar3;
  
  lVar3.base = leb_ParentNode(node);
  lVar2 = leb_DecodeSameDepthNeighborIDs(lVar3.base);
  uVar1 = lVar2.edge;
  if (uVar1 == 0) {
    uVar1 = lVar3.base.id;
  }
  lVar3.top = (leb_Node)((ulong)uVar1 | (ulong)lVar3.base & 0xffffffff00000000);
  return lVar3;
}

Assistant:

LEBDEF leb_DiamondParent leb_DecodeDiamondParent(const leb_Node node)
{
    leb_Node parentNode = leb_ParentNode(node);
    uint32_t diamondNodeID = leb_DecodeSameDepthNeighborIDs(parentNode).edge;
    leb_Node diamondNode = {
        diamondNodeID > 0u ? diamondNodeID : parentNode.id,
        parentNode.depth
    };

    return {parentNode, diamondNode};
}